

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O1

void __thiscall
NDeviceChannel::serialize<cereal::PortableBinaryInputArchive>
          (NDeviceChannel *this,PortableBinaryInputArchive *archive)

{
  PortableBinaryInputArchive *pPVar1;
  size_type size;
  size_t local_38;
  
  pPVar1 = (((archive->super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self)->
           super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self;
  cereal::PortableBinaryInputArchive::loadBinary<8ul>
            ((((((((pPVar1->super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self)->
                 super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self)->
               super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self)->
             super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self,&local_38,8);
  std::__cxx11::string::resize((ulong)&this->id,(char)local_38);
  cereal::PortableBinaryInputArchive::loadBinary<1ul>
            ((((pPVar1->super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self)->
             super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self,
             (this->id)._M_dataplus._M_p,local_38);
  cereal::PortableBinaryInputArchive::loadBinary<4ul>
            ((((archive->super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self)->
             super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self,&this->startByte,4);
  cereal::PortableBinaryInputArchive::loadBinary<4ul>
            ((((archive->super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self)->
             super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self,&this->startBit,4);
  cereal::PortableBinaryInputArchive::loadBinary<4ul>
            ((((archive->super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self)->
             super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self,&this->type,4);
  cereal::PortableBinaryInputArchive::loadBinary<4ul>
            ((((archive->super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self)->
             super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self,
             &this->interleavedDataByte,4);
  cereal::PortableBinaryInputArchive::loadBinary<4ul>
            ((((archive->super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self)->
             super_InputArchive<cereal::PortableBinaryInputArchive,_1U>).self,
             &this->interleavedDataBit,4);
  return;
}

Assistant:

void serialize(Archive &archive){
        archive(id, startByte, startBit, type, interleavedDataByte, interleavedDataBit);
    }